

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

bool __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::contains
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr,
          bool checkUsed)

{
  MemSegment *pMVar1;
  MemSegment **ppMVar2;
  
  ppMVar2 = &this->m_segList;
  while( true ) {
    pMVar1 = *ppMVar2;
    if (pMVar1 == (MemSegment *)0x0) {
      return false;
    }
    if ((pMVar1 <= ptr) && (ptr <= (void *)((long)&pMVar1->m_size + pMVar1->m_size))) break;
    ppMVar2 = &pMVar1->m_next;
  }
  if (!checkUsed) {
    return true;
  }
  return (bool)(*(byte *)((long)ptr + -8) & 1);
}

Assistant:

bool
    contains (T* ptr, bool checkUsed = false)
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            if (reinterpret_cast<char*>(ptr) >= reinterpret_cast<char*>(seg) &&
                reinterpret_cast<char*>(ptr) <= (reinterpret_cast<char*>(seg) + seg->getSize ()))
            {
                if (checkUsed)
                {
                    MemChunk* chunk = mem2Chunk (ptr);
                    return chunk->isUsed ();
                }
                return true;
            }
            seg = seg->getNext ();
        }
        return false;
    }